

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gil.h
# Opt level: O0

void __thiscall pybind11::gil_scoped_acquire::gil_scoped_acquire(gil_scoped_acquire *this)

{
  internals *piVar1;
  PyThreadState *pPVar2;
  gil_scoped_acquire *in_RDI;
  internals *internals;
  
  in_RDI->tstate = (PyThreadState *)0x0;
  in_RDI->release = true;
  in_RDI->active = true;
  piVar1 = pybind11::detail::get_internals();
  pPVar2 = (PyThreadState *)PyThread_tss_get(piVar1->tstate);
  in_RDI->tstate = pPVar2;
  if (in_RDI->tstate == (PyThreadState *)0x0) {
    pPVar2 = (PyThreadState *)PyGILState_GetThisThreadState();
    in_RDI->tstate = pPVar2;
  }
  if (in_RDI->tstate == (PyThreadState *)0x0) {
    pPVar2 = (PyThreadState *)PyThreadState_New(piVar1->istate);
    in_RDI->tstate = pPVar2;
    in_RDI->tstate->gilstate_counter = 0;
    PyThread_tss_set(piVar1->tstate,in_RDI->tstate);
  }
  else {
    pPVar2 = pybind11::detail::get_thread_state_unchecked();
    in_RDI->release = pPVar2 != in_RDI->tstate;
  }
  if ((in_RDI->release & 1U) != 0) {
    PyEval_AcquireThread(in_RDI->tstate);
  }
  inc_ref(in_RDI);
  return;
}

Assistant:

PYBIND11_NOINLINE gil_scoped_acquire() {
        auto &internals = detail::get_internals();
        tstate = (PyThreadState *) PYBIND11_TLS_GET_VALUE(internals.tstate);

        if (!tstate) {
            /* Check if the GIL was acquired using the PyGILState_* API instead (e.g. if
               calling from a Python thread). Since we use a different key, this ensures
               we don't create a new thread state and deadlock in PyEval_AcquireThread
               below. Note we don't save this state with internals.tstate, since we don't
               create it we would fail to clear it (its reference count should be > 0). */
            tstate = PyGILState_GetThisThreadState();
        }

        if (!tstate) {
            tstate = PyThreadState_New(internals.istate);
#        if defined(PYBIND11_DETAILED_ERROR_MESSAGES)
            if (!tstate) {
                pybind11_fail("scoped_acquire: could not create thread state!");
            }
#        endif
            tstate->gilstate_counter = 0;
            PYBIND11_TLS_REPLACE_VALUE(internals.tstate, tstate);
        } else {
            release = detail::get_thread_state_unchecked() != tstate;
        }

        if (release) {
            PyEval_AcquireThread(tstate);
        }

        inc_ref();
    }